

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyClient::TwoPartyClient
          (TwoPartyClient *this,AsyncIoStream *connection,Client *bootstrapInterface,Side side)

{
  MonotonicClock *clock;
  ReaderOptions receiveOptions;
  Maybe<capnp::Capability::Client> local_50;
  ReaderOptions local_38;
  Side local_22;
  Client *pCStack_20;
  Side side_local;
  Client *bootstrapInterface_local;
  AsyncIoStream *connection_local;
  TwoPartyClient *this_local;
  
  local_38.traversalLimitInWords = 0;
  local_38.nestingLimit = 0;
  local_38._12_4_ = 0;
  local_22 = side;
  pCStack_20 = bootstrapInterface;
  bootstrapInterface_local = (Client *)connection;
  connection_local = (AsyncIoStream *)this;
  ReaderOptions::ReaderOptions(&local_38);
  clock = kj::systemCoarseMonotonicClock();
  receiveOptions.nestingLimit = local_38.nestingLimit;
  receiveOptions.traversalLimitInWords = local_38.traversalLimitInWords;
  receiveOptions._12_4_ = 0;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&this->network,connection,side,receiveOptions,clock);
  kj::Maybe<capnp::Capability::Client>::Maybe(&local_50,bootstrapInterface);
  RpcSystem<capnp::rpc::twoparty::VatId>::
  RpcSystem<capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>
            (&this->rpcSystem,
             (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>
              *)this,&local_50);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&local_50);
  return;
}

Assistant:

TwoPartyClient::TwoPartyClient(kj::AsyncIoStream& connection,
                               Capability::Client bootstrapInterface,
                               rpc::twoparty::Side side)
    : network(connection, side),
      rpcSystem(network, bootstrapInterface) {}